

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O1

void do_affects(CHAR_DATA *ch,char *argument)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  long *plVar5;
  char *pcVar6;
  AFFECT_DATA *pAVar7;
  char *__format;
  short sVar8;
  AFFECT_DATA *pAVar9;
  uint __len;
  int iVar10;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  string __str;
  string __str_1;
  string buffer;
  char buf [4608];
  long *local_1528;
  undefined8 uStack_1520;
  long local_1518 [2];
  long *local_1508;
  undefined8 uStack_1500;
  long local_14f8 [2];
  long *local_14e8;
  char *local_14e0;
  long local_14d8 [2];
  _func_int **local_14c8;
  ulong local_14c0;
  long *local_14b8;
  undefined8 uStack_14b0;
  char *local_14a8;
  long *local_1498;
  undefined8 uStack_1490;
  char *local_1488;
  buffer<char> local_1470;
  char local_1450 [504];
  char local_1258 [4648];
  
  pAVar7 = ch->affected;
  if ((pAVar7 == (AFFECT_DATA *)0x0) ||
     ((pAVar7->aftype == 5 && (pAVar7->next == (AFFECT_DATA *)0x0)))) {
    send_to_char("You are not affected by anything.\n\r",ch);
    return;
  }
  send_to_char("You are affected by:\n\r",ch);
  pAVar7 = ch->affected;
  if (pAVar7 != (AFFECT_DATA *)0x0) {
    local_14c8 = (_func_int **)&PTR_grow_00457340;
    pAVar9 = (AFFECT_DATA *)0x0;
    do {
      if (pAVar7->aftype != 5) {
        memset(local_1258,0,0x1200);
        if (((pAVar9 == (AFFECT_DATA *)0x0) || (pAVar7->type != pAVar9->type)) ||
           (((pAVar7->name != (char *)0x0 || (pAVar9->name != (char *)0x0)) &&
            (bVar3 = str_cmp(pAVar7->name,pAVar9->name), bVar3)))) {
          switch(pAVar7->aftype) {
          case 1:
            pcVar6 = pAVar7->name;
            if (pcVar6 == (char *)0x0) {
              pcVar6 = skill_table[pAVar7->type].name;
            }
            __format = "Skill  : %-17s";
            break;
          case 2:
            pcVar6 = pAVar7->name;
            if (pcVar6 == (char *)0x0) {
              pcVar6 = skill_table[pAVar7->type].name;
            }
            __format = "Power  : %-17s";
            break;
          case 3:
            pcVar6 = pAVar7->name;
            if (pcVar6 == (char *)0x0) {
              pcVar6 = skill_table[pAVar7->type].name;
            }
            __format = "Malady : %-17s";
            break;
          case 4:
            pcVar6 = pAVar7->name;
            if (pcVar6 == (char *)0x0) {
              pcVar6 = skill_table[pAVar7->type].name;
            }
            __format = "Commune: %-17s";
            break;
          case 5:
            goto switchD_0024efd1_caseD_5;
          case 6:
            pcVar6 = pAVar7->name;
            if (pcVar6 == (char *)0x0) {
              pcVar6 = skill_table[pAVar7->type].name;
            }
            __format = "Rune   : %-17s";
            break;
          case 7:
            pcVar6 = pAVar7->name;
            if (pcVar6 == (char *)0x0) {
              pcVar6 = skill_table[pAVar7->type].name;
            }
            __format = "Timer  : %-17s";
            break;
          default:
            pcVar6 = pAVar7->name;
            if (pcVar6 == (char *)0x0) {
              pcVar6 = skill_table[pAVar7->type].name;
            }
            __format = "Spell  : %-17s";
          }
          sprintf(local_1258,__format,pcVar6);
        }
        else {
          if (ch->level < 0x14) goto LAB_0024f5c8;
          builtin_strncpy(local_1258 + 0x10,"          ",0xb);
          builtin_strncpy(local_1258,"                ",0x10);
        }
switchD_0024efd1_caseD_5:
        send_to_char(local_1258,ch);
        if (0x13 < ch->level) {
          local_14c0 = (ulong)(uint)(int)pAVar7->duration;
          if ((long)pAVar7->mod_name < 0) {
            plVar5 = (long *)affect_loc_name(0);
          }
          else {
            plVar5 = (long *)mod_names[pAVar7->mod_name].name;
          }
          if (pAVar7->mod_name < 0) {
            uVar4 = (uint)pAVar7->modifier;
            uVar1 = -uVar4;
            if (0 < (int)uVar4) {
              uVar1 = uVar4;
            }
            __len = 1;
            if (((9 < uVar1) && (__len = 2, 99 < uVar1)) && (__len = 3, 999 < uVar1)) {
              __len = 5 - (uVar1 < 10000);
            }
            local_1528 = local_1518;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_1528,(char)__len - (char)(pAVar7->modifier >> 7));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(uVar4 >> 0x1f) + (long)local_1528),__len,uVar1);
            pcVar6 = " by ";
          }
          else {
            local_1528 = local_1518;
            pcVar6 = "";
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1528,"","");
          }
          local_1498 = local_1528;
          uStack_1490 = uStack_1520;
          local_1470.size_ = 0;
          local_1470._vptr_buffer = local_14c8;
          local_1470.capacity_ = 500;
          fmt.size_ = 0x12;
          fmt.data_ = "| modifies {}{}{} ";
          args.field_1.values_ =
               (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_14b8;
          args.desc_ = 0xdcc;
          local_14b8 = plVar5;
          local_14a8 = pcVar6;
          local_1470.ptr_ = local_1450;
          ::fmt::v9::detail::vformat_to<char>(&local_1470,fmt,args,(locale_ref)0x0);
          local_14e8 = local_14d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_14e8,local_1470.ptr_,local_1470.ptr_ + local_1470.size_);
          if (local_1470.ptr_ != local_1450) {
            operator_delete(local_1470.ptr_,local_1470.capacity_);
          }
          uVar2 = local_14c0;
          if (local_1528 != local_1518) {
            operator_delete(local_1528,local_1518[0] + 1);
          }
          if (pAVar7->aftype != 5) {
            send_to_char((char *)local_14e8,ch);
          }
          if (pAVar7->duration == -1) {
            std::__cxx11::string::_M_replace((ulong)&local_14e8,0,local_14e0,0x386b1e);
          }
          else {
            iVar10 = (int)uVar2 + 1;
            sVar8 = (short)uVar2;
            if (sVar8 == 0) {
              local_1508 = local_14f8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1508,"","");
              local_14a8 = "";
            }
            else {
              uVar4 = iVar10 / 2;
              uVar1 = -uVar4;
              if (0 < (int)uVar4) {
                uVar1 = uVar4;
              }
              uVar4 = 1;
              if (((9 < uVar1) && (uVar4 = 2, 99 < uVar1)) && (uVar4 = 3, 999 < uVar1)) {
                uVar4 = 5 - (uVar1 < 10000);
              }
              local_1508 = local_14f8;
              std::__cxx11::string::_M_construct((ulong)&local_1508,(sVar8 < -2) + (char)uVar4);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)((long)local_1508 + (ulong)(sVar8 < -2)),uVar4,uVar1);
              local_14a8 = " and";
            }
            bVar3 = (uVar2 & 1) != 0;
            if (bVar3) {
              local_14a8 = "";
            }
            local_1498 = (long *)0x3a5dc4;
            if (!bVar3) {
              local_1498 = (long *)0x386b41;
            }
            local_1488 = "s";
            if (iVar10 == 2) {
              local_1488 = "";
            }
            if (sVar8 == 0) {
              local_1488 = "";
            }
            local_14b8 = local_1508;
            uStack_14b0 = uStack_1500;
            local_1470.size_ = 0;
            local_1470._vptr_buffer = local_14c8;
            local_1470.capacity_ = 500;
            fmt_00.size_ = 0x11;
            fmt_00.data_ = "for%s%s%s hour%s.";
            args_00.field_1.values_ =
                 (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_14b8;
            args_00.desc_ = 0xcccd;
            local_1470.ptr_ = local_1450;
            ::fmt::v9::detail::vformat_to<char>(&local_1470,fmt_00,args_00,(locale_ref)0x0);
            local_1528 = local_1518;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1528,local_1470.ptr_,local_1470.ptr_ + local_1470.size_);
            if (local_1470.ptr_ != local_1450) {
              operator_delete(local_1470.ptr_,local_1470.capacity_);
            }
            std::__cxx11::string::operator=((string *)&local_14e8,(string *)&local_1528);
            if (local_1528 != local_1518) {
              operator_delete(local_1528,local_1518[0] + 1);
            }
            if (local_1508 != local_14f8) {
              operator_delete(local_1508,local_14f8[0] + 1);
            }
          }
          if (pAVar7->aftype != 5) {
            send_to_char((char *)local_14e8,ch);
          }
          if (local_14e8 != local_14d8) {
            operator_delete(local_14e8,local_14d8[0] + 1);
          }
        }
        pAVar9 = pAVar7;
        if (pAVar7->aftype != 5) {
          send_to_char("\n\r",ch);
        }
      }
LAB_0024f5c8:
      pAVar7 = pAVar7->next;
    } while (pAVar7 != (AFFECT_DATA *)0x0);
  }
  return;
}

Assistant:

void do_affects(CHAR_DATA *ch, char *argument)
{
	if (ch->affected == nullptr || !(ch->affected->aftype != AFT_INVIS || ch->affected->next != nullptr))
	{
		send_to_char("You are not affected by anything.\n\r", ch);
		return;
	}

	send_to_char("You are affected by:\n\r", ch);

	AFFECT_DATA *paf_last = nullptr;
	char buf[MAX_STRING_LENGTH];
	for (auto paf = ch->affected; paf != nullptr; paf = paf->next)
	{
		if (paf->aftype == AFT_INVIS)
			continue;

		for (auto i = 0; i < MAX_STRING_LENGTH; i++)
		{
			buf[i] = '\0';
		}

		if (paf_last != nullptr
			&& (paf->type == paf_last->type && ((paf->name == nullptr && paf_last->name == nullptr) || !str_cmp(paf->name, paf_last->name))))
		{
			if (ch->level >= 20)
				sprintf(buf, "                          ");
			else
				continue;
		}
		else
		{
			if (paf->aftype == AFT_SKILL)
				sprintf(buf, "Skill  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_POWER)
				sprintf(buf, "Power  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_MALADY)
				sprintf(buf, "Malady : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_COMMUNE)
				sprintf(buf, "Commune: %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_RUNE)
				sprintf(buf, "Rune   : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype == AFT_TIMER)
				sprintf(buf, "Timer  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
			else if (paf->aftype != AFT_INVIS)
				sprintf(buf, "Spell  : %-17s", paf->name ? paf->name : skill_table[paf->type].name);
		}

		send_to_char(buf, ch);

		if (ch->level >= 20)
		{
			auto showdur = paf->duration + 1;

			auto buffer = fmt::format("| modifies {}{}{} ",
					(paf->mod_name > -1) ? mod_names[paf->mod_name].name : affect_loc_name(paf->location),
					(paf->mod_name > -1) ? "" : " by ",
					(paf->mod_name > -1) ? "" : std::to_string(paf->modifier)); //TODO: change the rest of the sprintf calls to format

			if (paf->aftype != AFT_INVIS)
				send_to_char(buffer.c_str(), ch);

			if (paf->duration == -1)
			{
				buffer = "permanently";
			}
			else
			{
				buffer = fmt::format("for%s%s%s hour%s.",
					(showdur == 1) ? "" : std::to_string(showdur / 2),
					(showdur % 2 == 0) ? "" : (showdur == 1) ? "" : " and", (showdur % 2 == 0) ? "" : " a half",
					(showdur == 1 || showdur == 2) ? "" : "s");
			}

			if (paf->aftype != AFT_INVIS)
				send_to_char(buffer.c_str(), ch);
		}

		if (paf->aftype != AFT_INVIS)
			send_to_char("\n\r", ch);

		paf_last = paf;
	}
}